

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::ProducerEndpointImpl::SetupDataSource
          (ProducerEndpointImpl *this,DataSourceInstanceID ds_id,DataSourceConfig *config)

{
  TaskRunner *pTVar1;
  element_type *ppPVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined8 *puVar4;
  WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl> weak_this;
  _Any_data local_398;
  code *local_388;
  code *pcStack_380;
  __shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
  local_378;
  __shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
  local_368;
  DataSourceInstanceID local_358;
  DataSourceConfig local_350;
  
  local_368._M_ptr = (element_type *)CONCAT62(local_368._M_ptr._2_6_,(short)config->target_buffer_);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::_M_insert_unique<unsigned_short>
            (&(this->allowed_target_buffers_)._M_t,(unsigned_short *)&local_368);
  std::
  __shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_378,
               (__shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                *)&this->weak_ptr_factory_);
  pTVar1 = this->task_runner_;
  std::
  __shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_368,&local_378);
  local_358 = ds_id;
  protos::gen::DataSourceConfig::DataSourceConfig(&local_350,config);
  local_388 = (code *)0x0;
  pcStack_380 = (code *)0x0;
  local_398._M_unused._M_object = (void *)0x0;
  local_398._8_8_ = 0;
  puVar4 = (undefined8 *)operator_new(0x338);
  _Var3._M_pi = local_368._M_refcount._M_pi;
  ppPVar2 = local_368._M_ptr;
  local_368._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_368._M_ptr = (element_type *)0x0;
  *puVar4 = ppPVar2;
  puVar4[1] = _Var3._M_pi;
  puVar4[2] = local_358;
  protos::gen::DataSourceConfig::DataSourceConfig((DataSourceConfig *)(puVar4 + 3),&local_350);
  pcStack_380 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:60077:26)>
                ::_M_invoke;
  local_388 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:60077:26)>
              ::_M_manager;
  local_398._M_unused._M_object = puVar4;
  (*pTVar1->_vptr_TaskRunner[2])(pTVar1);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_398);
  SetupDataSource(unsigned_long,perfetto::protos::gen::DataSourceConfig_const&)::$_0::~__0
            ((__0 *)&local_368);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_378._M_refcount);
  return;
}

Assistant:

void TracingServiceImpl::ProducerEndpointImpl::SetupDataSource(
    DataSourceInstanceID ds_id,
    const DataSourceConfig& config) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  allowed_target_buffers_.insert(static_cast<BufferID>(config.target_buffer()));
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostTask([weak_this, ds_id, config] {
    if (weak_this)
      weak_this->producer_->SetupDataSource(ds_id, std::move(config));
  });
}